

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_DecodeMonoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t predictor;
  uint uVar1;
  FAudioWaveFormatEx *pFVar2;
  float *pfVar3;
  int16_t iVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  int16_t sample1;
  int16_t delta;
  int16_t blockCache [1012];
  int16_t local_856;
  int16_t local_854;
  int16_t local_852;
  uint local_850;
  uint local_84c;
  uint local_848;
  uint local_844;
  FAudioVoice *local_840;
  ulong local_838;
  ulong local_830;
  float *local_828;
  long local_820;
  int16_t local_818 [1012];
  
  pFVar2 = (voice->field_19).src.format;
  uVar1 = (voice->field_19).src.curBufferOffset;
  local_850 = (uint)pFVar2[1].wFormatTag;
  uVar5 = (ulong)uVar1 % (ulong)local_850;
  puVar7 = buffer->pAudioData + (uVar1 / local_850) * (uint)pFVar2->nBlockAlign;
  local_830 = 0;
  local_84c = samples;
  local_840 = voice;
  while (local_848 = local_84c - (uint)local_830, (uint)local_830 <= local_84c && local_848 != 0) {
    local_844 = (uint)uVar5;
    local_838 = (ulong)(local_850 - local_844);
    predictor = *puVar7;
    local_852 = *(int16_t *)(puVar7 + 1);
    local_854 = *(int16_t *)(puVar7 + 3);
    local_856 = *(int16_t *)(puVar7 + 5);
    local_820 = (ulong)((local_840->field_19).src.format)->nBlockAlign - 7;
    local_828 = decodeCache;
    local_818[0] = local_856;
    local_818[1] = local_854;
    for (lVar8 = 0; pfVar3 = local_828, (int)local_820 != (int)lVar8; lVar8 = lVar8 + 1) {
      iVar4 = FAudio_INTERNAL_ParseNibble
                        (puVar7[lVar8 + 7] >> 4,predictor,&local_852,&local_854,&local_856);
      local_818[lVar8 * 2 + 2] = iVar4;
      iVar4 = FAudio_INTERNAL_ParseNibble
                        (puVar7[lVar8 + 7] & 0xf,predictor,&local_852,&local_854,&local_856);
      local_818[lVar8 * 2 + 3] = iVar4;
    }
    uVar6 = local_838 & 0xffffffff;
    if (local_848 < (uint)local_838) {
      uVar6 = (ulong)local_848;
    }
    (*FAudio_INTERNAL_Convert_S16_To_F32)(local_818 + local_844,local_828,(uint32_t)uVar6);
    decodeCache = pfVar3 + uVar6;
    puVar7 = puVar7 + lVar8 + 7;
    uVar5 = 0;
    local_830 = (ulong)((uint32_t)uVar6 + (int)local_830);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeMonoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[1012]; /* Max block size */

	/* Block size */
	uint32_t bsize = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeMonoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + midOffset,
			decodeCache,
			copy
		);
		decodeCache += copy;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}